

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormatSymbols::initialize(DecimalFormatSymbols *this)

{
  ushort uVar1;
  int32_t iVar2;
  UChar local_2a;
  ConstChar16Ptr local_28;
  char16_t *local_20;
  
  local_2a = L'.';
  if (*(short *)&this->field_0x10 < 0) {
    iVar2 = *(int32_t *)&this->field_0x14;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x10 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x8,0,iVar2,&local_2a,0,1);
  uVar1 = *(ushort *)&this->field_0x50 & 0x1e;
  if ((*(ushort *)&this->field_0x50 & 1) != 0) {
    uVar1 = 2;
  }
  *(ushort *)&this->field_0x50 = uVar1;
  local_2a = L';';
  if (*(short *)&this->field_0x90 < 0) {
    iVar2 = *(int32_t *)&this->field_0x94;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x90 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x88,0,iVar2,&local_2a,0,1);
  local_2a = L'%';
  if (*(short *)&this->field_0xd0 < 0) {
    iVar2 = *(int32_t *)&this->field_0xd4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0xd0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0xc8,0,iVar2,&local_2a,0,1);
  local_2a = L'0';
  if (*(short *)&this->field_0x110 < 0) {
    iVar2 = *(int32_t *)&this->field_0x114;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x110 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x108,0,iVar2,&local_2a,0,1);
  local_2a = L'1';
  if (*(short *)&this->field_0x490 < 0) {
    iVar2 = *(int32_t *)&this->field_0x494;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x490 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x488,0,iVar2,&local_2a,0,1);
  local_2a = L'2';
  if (*(short *)&this->field_0x4d0 < 0) {
    iVar2 = *(int32_t *)&this->field_0x4d4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x4d0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x4c8,0,iVar2,&local_2a,0,1);
  local_2a = L'3';
  if (*(short *)&this->field_0x510 < 0) {
    iVar2 = *(int32_t *)&this->field_0x514;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x510 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x508,0,iVar2,&local_2a,0,1);
  local_2a = L'4';
  if (*(short *)&this->field_0x550 < 0) {
    iVar2 = *(int32_t *)&this->field_0x554;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x550 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x548,0,iVar2,&local_2a,0,1);
  local_2a = L'5';
  if (*(short *)&this->field_0x590 < 0) {
    iVar2 = *(int32_t *)&this->field_0x594;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x590 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x588,0,iVar2,&local_2a,0,1);
  local_2a = L'6';
  if (*(short *)&this->field_0x5d0 < 0) {
    iVar2 = *(int32_t *)&this->field_0x5d4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x5d0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x5c8,0,iVar2,&local_2a,0,1);
  local_2a = L'7';
  if (*(short *)&this->field_0x610 < 0) {
    iVar2 = *(int32_t *)&this->field_0x614;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x610 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x608,0,iVar2,&local_2a,0,1);
  local_2a = L'8';
  if (*(short *)&this->field_0x650 < 0) {
    iVar2 = *(int32_t *)&this->field_0x654;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x650 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x648,0,iVar2,&local_2a,0,1);
  local_2a = L'9';
  if (*(short *)&this->field_0x690 < 0) {
    iVar2 = *(int32_t *)&this->field_0x694;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x690 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x688,0,iVar2,&local_2a,0,1);
  local_2a = L'#';
  if (*(short *)&this->field_0x150 < 0) {
    iVar2 = *(int32_t *)&this->field_0x154;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x150 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x148,0,iVar2,&local_2a,0,1);
  local_2a = L'+';
  if (*(short *)&this->field_0x1d0 < 0) {
    iVar2 = *(int32_t *)&this->field_0x1d4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x1d0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x1c8,0,iVar2,&local_2a,0,1);
  local_2a = L'-';
  if (*(short *)&this->field_0x190 < 0) {
    iVar2 = *(int32_t *)&this->field_0x194;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x190 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x188,0,iVar2,&local_2a,0,1);
  local_2a = L'¤';
  if (*(short *)&this->field_0x210 < 0) {
    iVar2 = *(int32_t *)&this->field_0x214;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x210 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x208,0,iVar2,&local_2a,0,1);
  local_28.p_ = L"¤¤";
  UnicodeString::setTo((UnicodeString *)&this->field_0x248,'\x01',&local_28,2);
  local_20 = local_28.p_;
  local_2a = L'.';
  if (*(short *)&this->field_0x290 < 0) {
    iVar2 = *(int32_t *)&this->field_0x294;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x290 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x288,0,iVar2,&local_2a,0,1);
  local_2a = L'E';
  if (*(short *)&this->field_0x2d0 < 0) {
    iVar2 = *(int32_t *)&this->field_0x2d4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x2d0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x2c8,0,iVar2,&local_2a,0,1);
  local_2a = L'‰';
  if (*(short *)&this->field_0x310 < 0) {
    iVar2 = *(int32_t *)&this->field_0x314;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x310 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x308,0,iVar2,&local_2a,0,1);
  local_2a = L'*';
  if (*(short *)&this->field_0x350 < 0) {
    iVar2 = *(int32_t *)&this->field_0x354;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x350 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x348,0,iVar2,&local_2a,0,1);
  local_2a = L'∞';
  if (*(short *)&this->field_0x390 < 0) {
    iVar2 = *(int32_t *)&this->field_0x394;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x390 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x388,0,iVar2,&local_2a,0,1);
  local_2a = L'�';
  if (*(short *)&this->field_0x3d0 < 0) {
    iVar2 = *(int32_t *)&this->field_0x3d4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x3d0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x3c8,0,iVar2,&local_2a,0,1);
  local_2a = L'@';
  if (*(short *)&this->field_0x410 < 0) {
    iVar2 = *(int32_t *)&this->field_0x414;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x410 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x408,0,iVar2,&local_2a,0,1);
  uVar1 = 2;
  if ((*(ushort *)&this->field_0x450 & 1) == 0) {
    uVar1 = *(ushort *)&this->field_0x450 & 0x1e;
  }
  *(ushort *)&this->field_0x450 = uVar1;
  local_2a = L'×';
  if (*(short *)&this->field_0x6d0 < 0) {
    iVar2 = *(int32_t *)&this->field_0x6d4;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x6d0 >> 5;
  }
  UnicodeString::doReplace((UnicodeString *)&this->field_0x6c8,0,iVar2,&local_2a,0,1);
  this->fIsCustomCurrencySymbol = '\0';
  this->fIsCustomIntlCurrencySymbol = '\0';
  this->fCodePointZero = 0x30;
  return;
}

Assistant:

void
DecimalFormatSymbols::initialize() {
    /*
     * These strings used to be in static arrays, but the HP/UX aCC compiler
     * cannot initialize a static array with class constructors.
     *  markus 2000may25
     */
    fSymbols[kDecimalSeparatorSymbol] = (UChar)0x2e;    // '.' decimal separator
    fSymbols[kGroupingSeparatorSymbol].remove();        //     group (thousands) separator
    fSymbols[kPatternSeparatorSymbol] = (UChar)0x3b;    // ';' pattern separator
    fSymbols[kPercentSymbol] = (UChar)0x25;             // '%' percent sign
    fSymbols[kZeroDigitSymbol] = (UChar)0x30;           // '0' native 0 digit
    fSymbols[kOneDigitSymbol] = (UChar)0x31;            // '1' native 1 digit
    fSymbols[kTwoDigitSymbol] = (UChar)0x32;            // '2' native 2 digit
    fSymbols[kThreeDigitSymbol] = (UChar)0x33;          // '3' native 3 digit
    fSymbols[kFourDigitSymbol] = (UChar)0x34;           // '4' native 4 digit
    fSymbols[kFiveDigitSymbol] = (UChar)0x35;           // '5' native 5 digit
    fSymbols[kSixDigitSymbol] = (UChar)0x36;            // '6' native 6 digit
    fSymbols[kSevenDigitSymbol] = (UChar)0x37;          // '7' native 7 digit
    fSymbols[kEightDigitSymbol] = (UChar)0x38;          // '8' native 8 digit
    fSymbols[kNineDigitSymbol] = (UChar)0x39;           // '9' native 9 digit
    fSymbols[kDigitSymbol] = (UChar)0x23;               // '#' pattern digit
    fSymbols[kPlusSignSymbol] = (UChar)0x002b;          // '+' plus sign
    fSymbols[kMinusSignSymbol] = (UChar)0x2d;           // '-' minus sign
    fSymbols[kCurrencySymbol] = (UChar)0xa4;            // 'OX' currency symbol
    fSymbols[kIntlCurrencySymbol].setTo(TRUE, INTL_CURRENCY_SYMBOL_STR, 2);
    fSymbols[kMonetarySeparatorSymbol] = (UChar)0x2e;   // '.' monetary decimal separator
    fSymbols[kExponentialSymbol] = (UChar)0x45;         // 'E' exponential
    fSymbols[kPerMillSymbol] = (UChar)0x2030;           // '%o' per mill
    fSymbols[kPadEscapeSymbol] = (UChar)0x2a;           // '*' pad escape symbol
    fSymbols[kInfinitySymbol] = (UChar)0x221e;          // 'oo' infinite
    fSymbols[kNaNSymbol] = (UChar)0xfffd;               // SUB NaN
    fSymbols[kSignificantDigitSymbol] = (UChar)0x0040;  // '@' significant digit
    fSymbols[kMonetaryGroupingSeparatorSymbol].remove(); // 
    fSymbols[kExponentMultiplicationSymbol] = (UChar)0xd7; // 'x' multiplication symbol for exponents
    fIsCustomCurrencySymbol = FALSE; 
    fIsCustomIntlCurrencySymbol = FALSE;
    fCodePointZero = 0x30;
    U_ASSERT(fCodePointZero == fSymbols[kZeroDigitSymbol].char32At(0));

}